

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::SPxMainSM<double>::aggregateVars
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,SVectorBase<double> *row,int *i)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  int *piVar2;
  undefined4 uVar3;
  double rhs;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  SPxSense SVar8;
  pointer pdVar9;
  Nonzero<double> *pNVar10;
  pointer pdVar11;
  DataKey *pDVar12;
  SPxMainSM<double> *this_00;
  bool bVar13;
  uint uVar14;
  double *pdVar15;
  ulong *puVar16;
  AggregationPS *this_01;
  SPxInternalCodeException *pSVar17;
  long lVar18;
  long lVar19;
  Item *pIVar20;
  int r;
  long lVar21;
  Item *pIVar22;
  double dVar23;
  Real RVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  double _aij;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int local_18c;
  double local_188;
  double local_180;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_154;
  double local_148;
  double _lower_j;
  double _upper_j;
  int _j;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  double local_d8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_b8;
  SPxMainSM<double> *local_a8;
  double new_lo_k;
  double local_98;
  undefined8 uStack_90;
  uint *local_80;
  long local_78;
  double new_up_k;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  pdVar9 = (lp->super_LPColSetBase<double>).low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  rhs = (lp->super_LPRowSetBase<double>).right.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [*i];
  pNVar10 = row->m_elem;
  iVar5 = pNVar10->idx;
  iVar6 = pNVar10[1].idx;
  dVar28 = pNVar10->val;
  uStack_154 = (undefined4)((ulong)dVar28 >> 0x20);
  dVar25 = pNVar10[1].val;
  local_168 = SUB84(dVar25,0);
  uStack_164 = (undefined4)((ulong)dVar25 >> 0x20);
  lVar18 = (long)iVar5;
  _lower_j = pdVar9[lVar18];
  pdVar11 = (lp->super_LPColSetBase<double>).up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  _upper_j = pdVar11[lVar18];
  lVar19 = (long)iVar6;
  dVar33 = pdVar9[lVar19];
  dVar27 = pdVar11[lVar19];
  local_80 = (uint *)i;
  dVar23 = feastol(this);
  bVar13 = EQrel<double,double,double>(_lower_j,_upper_j,dVar23);
  if (bVar13) {
    return OKAY;
  }
  dVar23 = feastol(this);
  bVar13 = EQrel<double,double,double>(dVar33,dVar27,dVar23);
  if (bVar13) {
    return OKAY;
  }
  dVar23 = dVar28 * dVar25;
  local_48._8_8_ = 0;
  local_48._0_8_ = dVar23;
  if (0.0 <= dVar23) {
    if (dVar23 <= 0.0) {
      pSVar17 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&ptr,"XMAISM12 This should never happen.",(allocator *)&local_b8);
      SPxInternalCodeException::SPxInternalCodeException(pSVar17,(string *)&ptr);
      __cxa_throw(pSVar17,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    pdVar15 = (double *)infinity();
    if (dVar33 <= -*pdVar15) {
      pdVar15 = (double *)infinity();
      local_148 = -*pdVar15;
    }
    else {
      local_148 = (rhs - dVar25 * dVar33) / dVar28;
    }
    pdVar15 = (double *)infinity();
    if (*pdVar15 <= dVar27) {
      pdVar15 = (double *)infinity();
      local_d8 = *pdVar15;
    }
    else {
      local_d8 = (rhs - dVar25 * dVar27) / dVar28;
    }
    pdVar15 = (double *)infinity();
    if (_lower_j <= -*pdVar15) {
      puVar16 = (ulong *)infinity();
      __j = (double)(*puVar16 ^ (ulong)DAT_002ce2e0);
    }
    else {
      __j = (rhs - dVar28 * _lower_j) / dVar25;
    }
    new_lo_k = __j;
    pdVar15 = (double *)infinity();
    uVar31 = SUB84(_upper_j,0);
    uVar32 = (undefined4)((ulong)_upper_j >> 0x20);
    if (*pdVar15 <= _upper_j) goto LAB_001ed755;
LAB_001ed661:
    dVar23 = (rhs - dVar28 * (double)CONCAT44(uVar32,uVar31)) / dVar25;
  }
  else {
    pdVar15 = (double *)infinity();
    if (*pdVar15 <= dVar27) {
      pdVar15 = (double *)infinity();
      local_148 = -*pdVar15;
    }
    else {
      local_148 = (rhs - dVar25 * dVar27) / dVar28;
    }
    pdVar15 = (double *)infinity();
    if (dVar33 <= -*pdVar15) {
      pdVar15 = (double *)infinity();
      local_d8 = *pdVar15;
    }
    else {
      local_d8 = (rhs - dVar25 * dVar33) / dVar28;
    }
    pdVar15 = (double *)infinity();
    if (*pdVar15 <= _upper_j) {
      puVar16 = (ulong *)infinity();
      __j = (double)(*puVar16 ^ (ulong)DAT_002ce2e0);
    }
    else {
      __j = (rhs - dVar28 * _upper_j) / dVar25;
    }
    new_lo_k = __j;
    pdVar15 = (double *)infinity();
    uVar31 = SUB84(_lower_j,0);
    uVar32 = (undefined4)((ulong)_lower_j >> 0x20);
    if (-*pdVar15 < _lower_j) goto LAB_001ed661;
LAB_001ed755:
    pdVar15 = (double *)infinity();
    dVar23 = *pdVar15;
  }
  new_up_k = dVar23;
  pdVar15 = (double *)infinity();
  local_a8 = this;
  local_78 = lVar18;
  uStack_54 = uStack_164;
  local_18c = iVar6;
  local_188 = dVar27;
  local_180 = dVar33;
  if ((-*pdVar15 < local_148) || (pdVar15 = (double *)infinity(), local_d8 < *pdVar15)) {
    pdVar15 = (double *)infinity();
    if ((__j <= -*pdVar15) && (pdVar15 = (double *)infinity(), *pdVar15 <= dVar23))
    goto LAB_001edb36;
    local_98 = (double)CONCAT44(local_98._4_4_,iVar5);
    psVar1 = &(this->super_SPxSimplifier<double>)._tolerances;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&ptr,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar24 = Tolerances::epsilon((Tolerances *)
                                 ptr.
                                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
    if (RVar24 <= local_148 - _lower_j) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ptr.
                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
LAB_001ed96a:
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&ptr,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar24 = Tolerances::epsilon((Tolerances *)
                                   ptr.
                                   super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar24 <= __j - dVar33) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ptr.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar24 = Tolerances::epsilon(local_b8._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ptr.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        iVar5 = local_98._0_4_;
        if (-RVar24 < dVar23 - dVar27) goto LAB_001edb65;
      }
LAB_001eda7d:
      iVar5 = local_98._0_4_;
      if (ABS(dVar28) <= ABS(dVar25)) goto LAB_001edb65;
    }
    else {
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar24 = Tolerances::epsilon(local_b8._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ptr.
                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if (local_d8 - _upper_j <= -RVar24) goto LAB_001ed96a;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&ptr,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar24 = Tolerances::epsilon((Tolerances *)
                                   ptr.
                                   super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (__j - dVar33 < RVar24) {
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar24 = Tolerances::epsilon(local_b8._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ptr.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        iVar5 = local_98._0_4_;
        if (dVar23 - dVar27 <= -RVar24) goto LAB_001edb36;
        goto LAB_001eda7d;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ptr.
                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      iVar5 = local_98._0_4_;
    }
LAB_001edb36:
    local_18c = iVar5;
    local_168 = SUB84(dVar28,0);
    local_78 = lVar19;
    lVar19 = lVar18;
    uStack_54 = uStack_154;
    dVar28 = dVar25;
    local_188 = _upper_j;
    local_180 = _lower_j;
    _lower_j = dVar33;
    _upper_j = dVar27;
    iVar5 = iVar6;
  }
LAB_001edb65:
  _j = iVar5;
  uStack_4c = 0;
  uStack_50 = 0;
  pIVar20 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  pDVar12 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey;
  pIVar22 = pIVar20 + pDVar12[lVar19].idx;
  pIVar20 = pIVar20 + pDVar12[local_78].idx;
  dVar25 = -dVar28 / (double)CONCAT44(uStack_54,local_168);
  local_98 = rhs / (double)CONCAT44(uStack_54,local_168);
  uStack_90 = 0;
  lVar18 = 8;
  local_58 = local_168;
  for (lVar21 = 0; this_00 = local_a8, lVar21 < (pIVar22->data).super_SVectorBase<double>.memused;
      lVar21 = lVar21 + 1) {
    pNVar10 = (pIVar22->data).super_SVectorBase<double>.m_elem;
    uVar7 = *(uint *)((long)&pNVar10->val + lVar18);
    if (uVar7 != *local_80) {
      dVar33 = *(double *)((long)pNVar10 + lVar18 + -8);
      dVar27 = (lp->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(int)uVar7];
      dVar23 = (lp->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(int)uVar7];
      pdVar15 = (double *)infinity();
      dVar26 = local_98 * dVar33;
      if (-*pdVar15 < dVar27) {
        ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(dVar27 - dVar26);
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])(lp,(ulong)uVar7,&ptr,0)
        ;
        piVar2 = &(local_a8->super_SPxSimplifier<double>).m_chgLRhs;
        *piVar2 = *piVar2 + 1;
      }
      pdVar15 = (double *)infinity();
      if (dVar23 < *pdVar15) {
        ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(dVar23 - dVar26);
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])(lp,(ulong)uVar7,&ptr,0)
        ;
        piVar2 = &(local_a8->super_SPxSimplifier<double>).m_chgLRhs;
        *piVar2 = *piVar2 + 1;
      }
      ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)(dVar33 * dVar25);
      uVar14 = SVectorBase<double>::pos((SVectorBase<double> *)pIVar20,uVar7);
      if (-1 < (int)uVar14) {
        ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 ((pIVar20->data).super_SVectorBase<double>.m_elem[uVar14].val +
                 (double)ptr.
                         super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
        piVar2 = &(local_a8->super_SPxSimplifier<double>).m_remNzos;
        *piVar2 = *piVar2 + 1;
      }
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                (lp,(ulong)uVar7,(ulong)(uint)_j,&ptr,0);
    }
    lVar18 = lVar18 + 0x10;
  }
  dVar33 = (lp->super_LPColSetBase<double>).object.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar19];
  SVar8 = lp->thesense;
  dVar27 = epsZero(local_a8);
  lVar19 = local_78;
  if (dVar27 < ABS(dVar33)) {
    if (SVar8 == MINIMIZE) {
      dVar33 = -dVar33;
    }
    (*(this_00->super_SPxSimplifier<double>)._vptr_SPxSimplifier[0x11])(local_98 * dVar33,this_00);
    dVar27 = (lp->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar19];
    if (lp->thesense == MINIMIZE) {
      dVar27 = -dVar27;
    }
    ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(dVar25 * dVar33 + dVar27);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x24])(lp,(ulong)(uint)_j,&ptr,0);
  }
  dVar27 = (double)CONCAT44(uStack_54,local_58) * local_188;
  dVar25 = ABS(rhs);
  auVar35._8_8_ = dVar27;
  auVar35._0_8_ = rhs;
  dVar27 = ABS(dVar27);
  dVar33 = dVar25;
  if (dVar25 <= dVar27) {
    dVar33 = dVar27;
  }
  dVar27 = (double)CONCAT44(uStack_54,local_58) * local_180;
  auVar34._8_8_ = dVar27;
  auVar34._0_8_ = rhs;
  dVar27 = ABS(dVar27);
  if (dVar25 <= dVar27) {
    dVar25 = dVar27;
  }
  dVar27 = 1.0;
  if (1.0 <= dVar33) {
    dVar27 = dVar33;
  }
  dVar33 = 1.0;
  if (1.0 <= dVar25) {
    dVar33 = dVar25;
  }
  auVar29._8_8_ = dVar27;
  auVar29._0_8_ = dVar27;
  auVar35 = divpd(auVar35,auVar29);
  dVar25 = auVar35._0_8_ - auVar35._8_8_;
  auVar30._8_8_ = dVar33;
  auVar30._0_8_ = dVar33;
  auVar35 = divpd(auVar34,auVar30);
  dVar23 = auVar35._0_8_ - auVar35._8_8_;
  dVar26 = epsZero(this_00);
  dVar25 = (double)(~-(ulong)(ABS(dVar25) <= dVar26) & (ulong)dVar25);
  dVar26 = epsZero(this_00);
  dVar23 = (double)(~-(ulong)(ABS(dVar23) <= dVar26) & (ulong)dVar23);
  if ((double)local_48._0_8_ <= 0.0) {
    if (0.0 <= (double)local_48._0_8_) {
      pSVar17 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&ptr,"XMAISM12 This should never happen.",(allocator *)&local_b8);
      SPxInternalCodeException::SPxInternalCodeException(pSVar17,(string *)&ptr);
      __cxa_throw(pSVar17,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    pdVar15 = (double *)infinity();
    if (local_180 <= -*pdVar15) {
      pdVar15 = (double *)infinity();
      new_lo_k = -*pdVar15;
    }
    else {
      new_lo_k = (dVar33 * dVar23) / dVar28;
    }
    local_168 = SUB84(new_lo_k,0);
    uStack_164 = (undefined4)((ulong)new_lo_k >> 0x20);
    pdVar15 = (double *)infinity();
    if (*pdVar15 <= local_188) goto LAB_001ee04c;
    dVar33 = dVar27 * dVar25;
  }
  else {
    pdVar15 = (double *)infinity();
    if (*pdVar15 <= local_188) {
      pdVar15 = (double *)infinity();
      new_lo_k = -*pdVar15;
    }
    else {
      new_lo_k = (dVar27 * dVar25) / dVar28;
    }
    local_168 = SUB84(new_lo_k,0);
    uStack_164 = (undefined4)((ulong)new_lo_k >> 0x20);
    pdVar15 = (double *)infinity();
    if (local_180 <= -*pdVar15) {
LAB_001ee04c:
      pdVar15 = (double *)infinity();
      dVar33 = *pdVar15;
      goto LAB_001ee055;
    }
    dVar33 = dVar33 * dVar23;
  }
  dVar33 = dVar33 / dVar28;
LAB_001ee055:
  new_up_k = dVar33;
  dVar28 = epsZero(this_00);
  if (dVar28 < (double)CONCAT44(uStack_164,local_168) - _lower_j) {
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
              (lp,(ulong)(uint)_j,&new_lo_k,0);
    piVar2 = &(this_00->super_SPxSimplifier<double>).m_chgBnds;
    *piVar2 = *piVar2 + 1;
  }
  dVar28 = epsZero(this_00);
  if (dVar33 - _upper_j < -dVar28) {
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])
              (lp,(ulong)(uint)_j,&new_up_k,0);
    piVar2 = &(this_00->super_SPxSimplifier<double>).m_chgBnds;
    *piVar2 = *piVar2 + 1;
  }
  this_01 = (AggregationPS *)operator_new(0xa8);
  uVar7 = *local_80;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &(this_00->super_SPxSimplifier<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  AggregationPS::AggregationPS
            (this_01,lp,uVar7,local_18c,rhs,_upper_j,_lower_j,
             (shared_ptr<soplex::Tolerances> *)&local_68);
  std::__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<soplex::SPxMainSM<double>::AggregationPS,void>
            ((__shared_ptr<soplex::SPxMainSM<double>::PostStep,(__gnu_cxx::_Lock_policy)2> *)&ptr,
             this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::push_back(&(this_00->m_hist).data,&ptr);
  removeRow(this_00,lp,*local_80);
  removeCol(this_00,lp,local_18c);
  uVar3 = (this_00->super_SPxSimplifier<double>).m_remRows;
  uVar4 = (this_00->super_SPxSimplifier<double>).m_remCols;
  (this_00->super_SPxSimplifier<double>).m_remRows = uVar3 + 1;
  (this_00->super_SPxSimplifier<double>).m_remCols = uVar4 + 1;
  piVar2 = &(this_00->super_SPxSimplifier<double>).m_remNzos;
  *piVar2 = *piVar2 + 2;
  piVar2 = (this_00->m_stat).data + 0xf;
  *piVar2 = *piVar2 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}